

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Scene * __thiscall CGL::GLScene::Scene::get_static_scene(Scene *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scene *this_00;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *__range2;
  pointer ppSVar4;
  pointer ppSVar5;
  SceneLight *local_70;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  staticLights;
  vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  staticObjects;
  
  staticObjects.
  super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  staticObjects.
  super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  staticObjects.
  super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  staticLights.
  super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  staticLights.
  super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  staticLights.
  super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppSVar1 = (this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar4 = (this->objects).
                 super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1;
      ppSVar4 = ppSVar4 + 1) {
    iVar3 = (*(*ppSVar4)->_vptr_SceneObject[0xc])();
    local_70 = (SceneLight *)CONCAT44(extraout_var,iVar3);
    std::vector<CGL::SceneObjects::SceneObject*,std::allocator<CGL::SceneObjects::SceneObject*>>::
    emplace_back<CGL::SceneObjects::SceneObject*>
              ((vector<CGL::SceneObjects::SceneObject*,std::allocator<CGL::SceneObjects::SceneObject*>>
                *)&staticObjects,(SceneObject **)&local_70);
  }
  ppSVar2 = (this->lights).
            super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar5 = (this->lights).
                 super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar2;
      ppSVar5 = ppSVar5 + 1) {
    iVar3 = (**(*ppSVar5)->_vptr_SceneLight)();
    local_70 = (SceneLight *)CONCAT44(extraout_var_00,iVar3);
    std::vector<CGL::SceneObjects::SceneLight*,std::allocator<CGL::SceneObjects::SceneLight*>>::
    emplace_back<CGL::SceneObjects::SceneLight*>
              ((vector<CGL::SceneObjects::SceneLight*,std::allocator<CGL::SceneObjects::SceneLight*>>
                *)&staticLights,&local_70);
  }
  this_00 = (Scene *)operator_new(0x30);
  SceneObjects::Scene::Scene(this_00,&staticObjects,&staticLights);
  std::
  _Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>::
  ~_Vector_base(&staticLights.
                 super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
               );
  std::
  _Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  ::~_Vector_base(&staticObjects.
                   super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
                 );
  return this_00;
}

Assistant:

SceneObjects::Scene *Scene::get_static_scene() {
  std::vector<SceneObjects::SceneObject *> staticObjects;
  std::vector<SceneObjects::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    staticObjects.push_back(obj->get_static_object());
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }

  return new SceneObjects::Scene(staticObjects, staticLights);
}